

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::perturbMaxLeave(SPxSolverBase<double> *this)

{
  UpdateVector<double> *pUVar1;
  SPxSolverBase<double> *in_RDI;
  double dVar2;
  int in_stack_0000003c;
  Status *in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  VectorBase<double> *in_stack_00000058;
  VectorBase<double> *in_stack_00000060;
  UpdateVector<double> *in_stack_00000068;
  SPxSolverBase<double> *in_stack_00000070;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff7c;
  SSVectorBase<double> *in_stack_ffffffffffffff90;
  double local_20;
  double local_18;
  int local_c [3];
  
  local_c[0] = SPxBasisBase<double>::iteration(&in_RDI->super_SPxBasisBase<double>);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
  SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[37],_int,_double,_0>
            (in_RDI,(char (*) [37])"DSHIFT06 iteration= {} perturbing {}",local_c,&local_18);
  pUVar1 = pVec(in_RDI);
  UpdateVector<double>::delta(pUVar1);
  SSVectorBase<double>::setup(in_stack_ffffffffffffff90);
  pUVar1 = coPvec(in_RDI);
  UpdateVector<double>::delta(pUVar1);
  SSVectorBase<double>::setup(in_stack_ffffffffffffff90);
  pVec(in_RDI);
  lpBound(in_RDI);
  upBound(in_RDI);
  epsilon((SPxSolverBase<double> *)0x224896);
  leavetol((SPxSolverBase<double> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  SPxBasisBase<double>::Desc::status((Desc *)0x2248c5);
  uVar3 = 1;
  dVar2 = perturbMax(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                     in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c,
                     (int)this);
  in_RDI->theShift = dVar2 + in_RDI->theShift;
  coPvec(in_RDI);
  lcBound(in_RDI);
  ucBound(in_RDI);
  epsilon((SPxSolverBase<double> *)0x22493e);
  leavetol((SPxSolverBase<double> *)CONCAT44(in_stack_ffffffffffffff7c,uVar3));
  SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  SPxBasisBase<double>::Desc::coStatus((Desc *)0x22496d);
  dVar2 = perturbMax(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                     in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c,
                     (int)this);
  in_RDI->theShift = dVar2 + in_RDI->theShift;
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
  SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[7],_double,_0>
            (in_RDI,(char (*) [7])"\t->{}\n",&local_20);
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMaxLeave(void)
{
   SPxOut::debug(this, "DSHIFT06 iteration= {} perturbing {}", this->iteration(), shift());
   pVec().delta().setup();
   coPvec().delta().setup();
   theShift += perturbMax(pVec(), lpBound(), upBound(), epsilon(), leavetol(),
                          this->desc().status(), 0, 1);
   theShift += perturbMax(coPvec(), lcBound(), ucBound(), epsilon(), leavetol(),
                          this->desc().coStatus(), 0, 1);
   SPxOut::debug(this, "\t->{}\n", shift());
}